

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cpp
# Opt level: O0

void duckdb_brotli::BrotliEncoderDestroyInstance(BrotliEncoderStateInternal *state)

{
  long in_RDI;
  MemoryManager *in_stack_00000008;
  void *in_stack_00000010;
  
  if (in_RDI != 0) {
    BrotliEncoderCleanupState(state);
    BrotliBootstrapFree(in_stack_00000010,in_stack_00000008);
  }
  return;
}

Assistant:

void duckdb_brotli::BrotliEncoderDestroyInstance(BrotliEncoderState* state) {
  if (!state) {
    return;
  } else {
    BrotliEncoderCleanupState(state);
    BrotliBootstrapFree(state, &state->memory_manager_);
  }
}